

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

void __thiscall Blip_Buffer::clock_rate(Blip_Buffer *this,long cps)

{
  ulong in_RSI;
  ulong *in_RDI;
  double dVar1;
  
  in_RDI[7] = in_RSI;
  dVar1 = floor(((double)(long)in_RDI[6] / (double)(long)in_RSI) * 65536.0 + 0.5);
  *in_RDI = (long)dVar1 | (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f;
  if (*in_RDI != 0) {
    return;
  }
  __assert_fail("( \"unmet requirement\", factor_ > 0 )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Blip_Buffer.cpp"
                ,0x59,"void Blip_Buffer::clock_rate(long)");
}

Assistant:

void Blip_Buffer::clock_rate( long cps )
{
	clocks_per_sec = cps;
	factor_ = (unsigned long) floor( (double) samples_per_sec / cps *
			(1L << BLIP_BUFFER_ACCURACY) + 0.5 );
	require( factor_ > 0 ); // clock_rate/sample_rate ratio is too large
}